

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool __thiscall vkb::SystemInfo::is_extension_available(SystemInfo *this,char *extension_name)

{
  pointer pVVar1;
  int iVar2;
  pointer __s2;
  bool bVar3;
  
  if (extension_name == (char *)0x0) {
    bVar3 = false;
  }
  else {
    __s2 = (this->available_extensions).
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_start;
    pVVar1 = (this->available_extensions).
             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar3 = __s2 != pVVar1;
    if (bVar3) {
      iVar2 = strcmp(extension_name,__s2->extensionName);
      while (iVar2 != 0) {
        __s2 = __s2 + 1;
        bVar3 = __s2 != pVVar1;
        if (__s2 == pVVar1) {
          return bVar3;
        }
        iVar2 = strcmp(extension_name,__s2->extensionName);
      }
    }
  }
  return bVar3;
}

Assistant:

bool SystemInfo::is_extension_available(const char* extension_name) const {
    if (!extension_name) return false;
    return detail::check_extension_supported(available_extensions, extension_name);
}